

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_escape_sequence<std::vector<char,std::allocator<char>>>
          (result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  const_iterator rollback;
  long lVar4;
  value_type *pvVar5;
  location<std::vector<char,_std::allocator<char>_>_> *loc_00;
  uint *loc_01;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  size_type sVar9;
  _Alloc_hider _Var10;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  string msg;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  token;
  undefined1 local_148 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_130;
  allocator_type local_119;
  string local_118;
  undefined1 local_f8 [8];
  undefined1 local_f0 [8];
  region_base local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_e0 [3];
  string local_a8;
  undefined1 local_88 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  location<std::vector<char,_std::allocator<char>_>_> *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  rollback._M_current = *(char **)(this + 0x40);
  local_f8 = (undefined1  [8])this;
  if ((rollback._M_current == *(char **)(*(long *)(this + 8) + 8)) || (*rollback._M_current != '\\')
     ) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"[error]: toml::parse_escape_sequence: ","");
    local_f0 = (undefined1  [8])aaStack_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,"the next token is not a backslash \"\\\"","");
    __l._M_len = 1;
    __l._M_array = (iterator)local_f8;
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_88,__l,(allocator_type *)&local_48);
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    format_underline(&local_118,&local_a8,
                     (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_88,&local_68);
    local_148._16_8_ = local_118.field_2._M_allocated_capacity;
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_148 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p == &local_118.field_2) {
      aStack_130._0_8_ = local_118.field_2._8_8_;
      local_148._0_8_ = paVar2;
    }
    else {
      local_148._0_8_ = local_118._M_dataplus._M_p;
    }
    local_118.field_2._M_allocated_capacity =
         local_118.field_2._M_allocated_capacity & 0xffffffffffffff00;
    __return_storage_ptr__->is_ok_ = false;
    paVar1 = &(__return_storage_ptr__->field_1).succ.value.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_1 = paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._0_8_ == paVar2) {
      paVar1->_M_allocated_capacity = local_148._16_8_;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ.value.field_2 + 8) =
           aStack_130._0_8_;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value._M_dataplus._M_p = (pointer)local_148._0_8_;
      (__return_storage_ptr__->field_1).succ.value.field_2._M_allocated_capacity = local_148._16_8_;
    }
    (__return_storage_ptr__->field_1).succ.value._M_string_length = local_118._M_string_length;
    local_148._16_8_ = local_148._16_8_ & 0xffffffffffffff00;
    local_118._M_string_length = 0;
    local_148._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_148._0_8_ = paVar2;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_88);
    if (local_f0 != (undefined1  [8])aaStack_e0) {
      operator_delete((void *)local_f0,aaStack_e0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
      return __return_storage_ptr__;
    }
    sVar9 = CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,local_a8.field_2._M_local_buf[0]);
    _Var10._M_p = local_a8._M_dataplus._M_p;
LAB_00122eea:
    operator_delete(_Var10._M_p,sVar9 + 1);
  }
  else {
    lVar4 = (ulong)(*rollback._M_current == '\n') + *(long *)(this + 0x18);
    *(long *)(this + 0x18) = lVar4;
    *(char **)(this + 0x40) = rollback._M_current + 1;
    bVar3 = rollback._M_current[1];
    loc_00 = (location<std::vector<char,_std::allocator<char>_>_> *)(ulong)bVar3;
    if (bVar3 < 0x62) {
      if (bVar3 == 0x22) {
        *(ulong *)(this + 0x18) = lVar4 + (ulong)(rollback._M_current[1] == '\n');
        *(char **)(this + 0x40) = rollback._M_current + 2;
        pcVar8 = "\"";
        pcVar7 = "";
      }
      else {
        if (bVar3 == 0x55) {
          sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>
          ::invoke<std::vector<char,std::allocator<char>>>
                    ((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                      *)local_f8,
                     (sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>
                      *)this,loc);
          if (local_f8[0] != (string)0x1) {
            local_88._0_8_ = local_88 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_88,
                       "[error] parse_escape_sequence: invalid token found in UTF-8 codepoint Uxxxxxxxx"
                       ,"");
            local_50 = (location<std::vector<char,_std::allocator<char>_>_> *)this;
            std::
            pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[5],_true>
                      ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_148,&local_50,(char (*) [5])0x14b79b);
            __l_02._M_len = 1;
            __l_02._M_array = (iterator)local_148;
            std::
            vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_68,__l_02,&local_119);
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            format_underline(&local_a8,(string *)local_88,
                             (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_68,&local_48);
            goto LAB_0012302f;
          }
          pvVar5 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                   ::unwrap((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                             *)local_f8);
          read_utf8_codepoint<std::vector<char,std::allocator<char>>,std::vector<char,std::allocator<char>>>
                    (&local_118,(detail *)pvVar5,
                     (region<std::vector<char,_std::allocator<char>_>_> *)this,loc_00);
          goto LAB_00122d89;
        }
        if (bVar3 != 0x5c) goto switchD_00122a54_caseD_6f;
        *(ulong *)(this + 0x18) = lVar4 + (ulong)(rollback._M_current[1] == '\n');
        *(char **)(this + 0x40) = rollback._M_current + 2;
        pcVar8 = "\\";
        pcVar7 = "";
      }
    }
    else {
      uVar6 = bVar3 - 0x6e;
      if (uVar6 < 8) {
        loc_01 = &switchD_00122a54::switchdataD_001490d8;
        switch((uint)bVar3) {
        case 0x6e:
          *(ulong *)(this + 0x18) = lVar4 + (ulong)(rollback._M_current[1] == '\n');
          *(char **)(this + 0x40) = rollback._M_current + 2;
          pcVar8 = "\n";
          pcVar7 = "";
          break;
        default:
switchD_00122a54_caseD_6f:
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,
                     "[error] parse_escape_sequence: unknown escape sequence appeared.","");
          local_f0 = (undefined1  [8])aaStack_e0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_f0,
                     "escape sequence is one of \\, \", b, t, n, f, r, uxxxx, Uxxxxxxxx","");
          __l_00._M_len = 1;
          __l_00._M_array = (iterator)local_f8;
          std::
          vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_88,__l_00,(allocator_type *)&local_48);
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,
                     "if you want to write backslash as just one backslash, use literal string like: regex    = \'<\\i\\c*\\s*>\'"
                     ,"");
          __l_01._M_len = 1;
          __l_01._M_array = &local_a8;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_68,__l_01,(allocator_type *)&local_50);
          format_underline((string *)local_148,&local_118,
                           (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_88,&local_68);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,
                            CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                     local_a8.field_2._M_local_buf[0]) + 1);
          }
          std::
          vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_88);
          if (local_f0 != (undefined1  [8])aaStack_e0) {
            operator_delete((void *)local_f0,aaStack_e0[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          location<std::vector<char,_std::allocator<char>_>_>::reset
                    ((location<std::vector<char,_std::allocator<char>_>_> *)this,rollback);
          local_f8 = (undefined1  [8])&local_e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_f8,local_148._0_8_,(char *)(local_148._8_8_ + local_148._0_8_))
          ;
          __return_storage_ptr__->is_ok_ = false;
          paVar2 = &(__return_storage_ptr__->field_1).succ.value.field_2;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)&__return_storage_ptr__->field_1 = paVar2;
          if (local_f8 == (undefined1  [8])&local_e8) {
            paVar2->_M_allocated_capacity = (size_type)local_e8._vptr_region_base;
            *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ.value.field_2 + 8) =
                 aaStack_e0[0]._M_allocated_capacity;
          }
          else {
            (__return_storage_ptr__->field_1).succ.value._M_dataplus._M_p = (pointer)local_f8;
            (__return_storage_ptr__->field_1).succ.value.field_2._M_allocated_capacity =
                 (size_type)local_e8._vptr_region_base;
          }
          (__return_storage_ptr__->field_1).succ.value._M_string_length = (size_type)local_f0;
          sVar9 = local_148._16_8_;
          _Var10._M_p = (pointer)local_148._0_8_;
          if ((undefined1 *)local_148._0_8_ == local_148 + 0x10) {
            return __return_storage_ptr__;
          }
          goto LAB_00122eea;
        case 0x72:
          *(ulong *)(this + 0x18) = lVar4 + (ulong)(rollback._M_current[1] == '\n');
          *(char **)(this + 0x40) = rollback._M_current + 2;
          pcVar8 = "\r";
          pcVar7 = "";
          break;
        case 0x74:
          *(ulong *)(this + 0x18) = lVar4 + (ulong)(rollback._M_current[1] == '\n');
          *(char **)(this + 0x40) = rollback._M_current + 2;
          pcVar8 = "\t";
          pcVar7 = "";
          break;
        case 0x75:
          sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>
          ::invoke<std::vector<char,std::allocator<char>>>
                    ((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                      *)local_f8,
                     (sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>
                      *)this,(location<std::vector<char,_std::allocator<char>_>_> *)
                             ((long)&switchD_00122a54::switchdataD_001490d8 +
                             (long)(int)(&switchD_00122a54::switchdataD_001490d8)[uVar6]));
          if (local_f8[0] != (string)0x1) {
            local_88._0_8_ = local_88 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_88,
                       "[error] parse_escape_sequence: invalid token found in UTF-8 codepoint uXXXX."
                       ,"");
            local_50 = (location<std::vector<char,_std::allocator<char>_>_> *)this;
            std::
            pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[5],_true>
                      ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_148,&local_50,(char (*) [5])0x14b79b);
            __l_03._M_len = 1;
            __l_03._M_array = (iterator)local_148;
            std::
            vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_68,__l_03,&local_119);
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            format_underline(&local_a8,(string *)local_88,
                             (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_68,&local_48);
LAB_0012302f:
            paVar2 = &local_118.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
              local_118.field_2._8_8_ = local_a8.field_2._8_8_;
              local_118._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_118._M_dataplus._M_p = local_a8._M_dataplus._M_p;
            }
            local_118.field_2._M_allocated_capacity._1_7_ =
                 local_a8.field_2._M_allocated_capacity._1_7_;
            local_118.field_2._M_local_buf[0] = local_a8.field_2._M_local_buf[0];
            __return_storage_ptr__->is_ok_ = false;
            paVar1 = &(__return_storage_ptr__->field_1).succ.value.field_2;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)&__return_storage_ptr__->field_1 = paVar1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p == paVar2) {
              paVar1->_M_allocated_capacity = local_118.field_2._M_allocated_capacity;
              *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ.value.field_2 + 8) =
                   local_118.field_2._8_8_;
            }
            else {
              (__return_storage_ptr__->field_1).succ.value._M_dataplus._M_p =
                   local_118._M_dataplus._M_p;
              (__return_storage_ptr__->field_1).succ.value.field_2._M_allocated_capacity =
                   local_118.field_2._M_allocated_capacity;
            }
            (__return_storage_ptr__->field_1).succ.value._M_string_length =
                 local_a8._M_string_length;
            local_118.field_2._M_allocated_capacity =
                 (ulong)(uint7)local_a8.field_2._M_allocated_capacity._1_7_ << 8;
            local_a8.field_2._M_local_buf[0] = '\0';
            local_a8._M_string_length = 0;
            local_118._M_string_length = 0;
            local_118._M_dataplus._M_p = (pointer)paVar2;
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_48);
            std::
            vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_68);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._8_8_ != &aStack_130) {
              operator_delete((void *)local_148._8_8_,aStack_130._0_8_ + 1);
            }
            if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
              operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
            }
            goto LAB_0012313e;
          }
          pvVar5 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                   ::unwrap((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                             *)local_f8);
          read_utf8_codepoint<std::vector<char,std::allocator<char>>,std::vector<char,std::allocator<char>>>
                    (&local_118,(detail *)pvVar5,
                     (region<std::vector<char,_std::allocator<char>_>_> *)this,
                     (location<std::vector<char,_std::allocator<char>_>_> *)loc_01);
LAB_00122d89:
          local_148._16_8_ = local_118.field_2._M_allocated_capacity;
          sVar9 = local_118._M_string_length;
          paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_148 + 0x10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p == &local_118.field_2) {
            aStack_130._0_8_ = local_118.field_2._8_8_;
            local_148._0_8_ = paVar2;
          }
          else {
            local_148._0_8_ = local_118._M_dataplus._M_p;
          }
          local_118._M_string_length = 0;
          local_118.field_2._M_allocated_capacity =
               local_118.field_2._M_allocated_capacity & 0xffffffffffffff00;
          __return_storage_ptr__->is_ok_ = true;
          paVar1 = &(__return_storage_ptr__->field_1).succ.value.field_2;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)&__return_storage_ptr__->field_1 = paVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._0_8_ == paVar2) {
            paVar1->_M_allocated_capacity = local_148._16_8_;
            *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ.value.field_2 + 8) =
                 aStack_130._0_8_;
          }
          else {
            (__return_storage_ptr__->field_1).succ.value._M_dataplus._M_p = (pointer)local_148._0_8_
            ;
            (__return_storage_ptr__->field_1).succ.value.field_2._M_allocated_capacity =
                 local_148._16_8_;
          }
          (__return_storage_ptr__->field_1).succ.value._M_string_length = sVar9;
          local_148._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_148._16_8_ = local_148._16_8_ & 0xffffffffffffff00;
          local_148._0_8_ = paVar2;
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
LAB_0012313e:
          if (local_f8[0] != (string)0x1) {
            return __return_storage_ptr__;
          }
          region<std::vector<char,_std::allocator<char>_>_>::~region
                    ((region<std::vector<char,_std::allocator<char>_>_> *)local_f0);
          return __return_storage_ptr__;
        }
      }
      else if (bVar3 == 0x62) {
        *(ulong *)(this + 0x18) = lVar4 + (ulong)(rollback._M_current[1] == '\n');
        *(char **)(this + 0x40) = rollback._M_current + 2;
        pcVar8 = "\b";
        pcVar7 = "";
      }
      else {
        if (bVar3 != 0x66) goto switchD_00122a54_caseD_6f;
        *(ulong *)(this + 0x18) = lVar4 + (ulong)(rollback._M_current[1] == '\n');
        *(char **)(this + 0x40) = rollback._M_current + 2;
        pcVar8 = "\f";
        pcVar7 = "";
      }
    }
    local_148._0_8_ = (region_base *)(local_148 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_148,pcVar8,pcVar7);
    if ((region_base *)local_148._0_8_ == (region_base *)(local_148 + 0x10)) {
      aaStack_e0[0]._M_allocated_capacity = aStack_130._0_8_;
      local_f8 = (undefined1  [8])&local_e8;
    }
    else {
      local_f8 = (undefined1  [8])local_148._0_8_;
    }
    __return_storage_ptr__->is_ok_ = true;
    paVar2 = &(__return_storage_ptr__->field_1).succ.value.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_1 = paVar2;
    if (local_f8 == (undefined1  [8])&local_e8) {
      paVar2->_M_allocated_capacity = local_148._16_8_;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ.value.field_2 + 8) =
           aaStack_e0[0]._M_allocated_capacity;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value._M_dataplus._M_p = (pointer)local_f8;
      (__return_storage_ptr__->field_1).succ.value.field_2._M_allocated_capacity = local_148._16_8_;
    }
    (__return_storage_ptr__->field_1).succ.value._M_string_length = local_148._8_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

result<std::string, std::string> parse_escape_sequence(location<Container>& loc)
{
    const auto first = loc.iter();
    if(first == loc.end() || *first != '\\')
    {
        return err(format_underline("[error]: toml::parse_escape_sequence: ", {{
            std::addressof(loc), "the next token is not a backslash \"\\\""}}));
    }
    loc.advance();
    switch(*loc.iter())
    {
        case '\\':{loc.advance(); return ok(std::string("\\"));}
        case '"' :{loc.advance(); return ok(std::string("\""));}
        case 'b' :{loc.advance(); return ok(std::string("\b"));}
        case 't' :{loc.advance(); return ok(std::string("\t"));}
        case 'n' :{loc.advance(); return ok(std::string("\n"));}
        case 'f' :{loc.advance(); return ok(std::string("\f"));}
        case 'r' :{loc.advance(); return ok(std::string("\r"));}
        case 'u' :
        {
            if(const auto token = lex_escape_unicode_short::invoke(loc))
            {
                return ok(read_utf8_codepoint(token.unwrap(), loc));
            }
            else
            {
                return err(format_underline("[error] parse_escape_sequence: "
                           "invalid token found in UTF-8 codepoint uXXXX.",
                           {{std::addressof(loc), "here"}}));
            }
        }
        case 'U':
        {
            if(const auto token = lex_escape_unicode_long::invoke(loc))
            {
                return ok(read_utf8_codepoint(token.unwrap(), loc));
            }
            else
            {
                return err(format_underline("[error] parse_escape_sequence: "
                           "invalid token found in UTF-8 codepoint Uxxxxxxxx",
                           {{std::addressof(loc), "here"}}));
            }
        }
    }

    const auto msg = format_underline("[error] parse_escape_sequence: "
           "unknown escape sequence appeared.", {{std::addressof(loc),
           "escape sequence is one of \\, \", b, t, n, f, r, uxxxx, Uxxxxxxxx"}},
           /* Hints = */{"if you want to write backslash as just one backslash, "
           "use literal string like: regex    = '<\\i\\c*\\s*>'"});
    loc.reset(first);
    return err(msg);
}